

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O3

void __thiscall
test_matrix_sparse_reserve_capacity_Test::~test_matrix_sparse_reserve_capacity_Test
          (test_matrix_sparse_reserve_capacity_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_matrix_sparse, reserve_capacity) {
  Matrix_Sparse matrix;
  EXPECT_EQ(matrix.capacity().first, 0);
  EXPECT_EQ(matrix.capacity().second, 0);

  matrix.reserve(10, 40);
  EXPECT_EQ(matrix.capacity().first, 11);
  EXPECT_EQ(matrix.capacity().second, 40);
}